

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_finite(REF_GRID ref_grid,REF_INT ldim,REF_DBL *field)

{
  uint uVar1;
  uint local_34;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT n;
  REF_INT node;
  REF_INT i;
  REF_DBL *field_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  local_34 = 0;
  for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_grid->node->max;
      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
    if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_grid->node->max)) &&
       (-1 < ref_grid->node->global[ref_private_macro_code_rss])) {
      for (n = 0; n < ldim; n = n + 1) {
        if (0x7fefffffffffffff < (ulong)ABS(field[n + ldim * ref_private_macro_code_rss])) {
          local_34 = local_34 + 1;
        }
      }
    }
  }
  _node = field;
  field_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  uVar1 = ref_mpi_allsum(ref_grid->mpi,&local_34,1,1);
  if (uVar1 == 0) {
    if ((int)local_34 < 1) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      if (pRStack_18->mpi->id == 0) {
        printf("%d not finite\n",(ulong)local_34);
      }
      ref_grid_local._4_4_ = 3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x213,"ref_validation_finite",(ulong)uVar1,"global");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_validation_finite(REF_GRID ref_grid, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT i, node, n;
  n = 0;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < ldim; i++) {
      if (!isfinite(field[i + ldim * node])) n++;
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &n, 1, REF_INT_TYPE), "global");
  if (n > 0) {
    if (ref_mpi_once(ref_grid_mpi(ref_grid))) printf("%d not finite\n", n);
    return REF_INVALID;
  }
  return REF_SUCCESS;
}